

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::initsamplesize(aalcalc *this,string *path)

{
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  FILE *__stream;
  undefined8 extraout_RAX;
  int summarycalcstream_type;
  string s;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  ulong local_50;
  _Base_ptr local_38;
  
  local_38 = (_Base_ptr)path;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    do {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) {
        return;
      }
      local_58 = &stack0xffffffffffffffb8;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffa8,pdVar3->d_name,pdVar3->d_name + sVar4);
      bVar1 = true;
      if (4 < local_50) {
        std::__cxx11::string::substr((ulong)local_78,(ulong)&stack0xffffffffffffffa8);
        iVar2 = std::__cxx11::string::compare((char *)local_78);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        if (iVar2 == 0) {
          local_78[0] = local_68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,*(long *)local_38,
                     (long)&local_38->_M_parent->_M_color + *(long *)local_38);
          std::__cxx11::string::append((char *)local_78);
          std::__cxx11::string::operator=((string *)&stack0xffffffffffffffa8,(string *)local_78);
          if (local_78[0] != local_68) {
            operator_delete(local_78[0]);
          }
          __stream = fopen(local_58,"rb");
          if (__stream == (FILE *)0x0) {
            initsamplesize((aalcalc *)&stack0xffffffffffffffa8);
            if (local_78[0] != local_68) {
              operator_delete(local_78[0]);
            }
            if (local_58 != &stack0xffffffffffffffb8) {
              operator_delete(local_58);
            }
            _Unwind_Resume(extraout_RAX);
          }
          local_78[0] = (undefined1 *)((ulong)local_78[0] & 0xffffffff00000000);
          fread((string *)local_78,4,1,__stream);
          fread(&this->samplesize_,4,1,__stream);
          fclose(__stream);
          bVar1 = false;
        }
      }
      if (local_58 != &stack0xffffffffffffffb8) {
        operator_delete(local_58);
      }
    } while (bVar1);
  }
  return;
}

Assistant:

void aalcalc::initsamplesize(const std::string &path)
{
	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				FILE *fin = fopen(s.c_str(), "rb");
				if (fin == NULL) {
					fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
					exit(EXIT_FAILURE);
				}
				int summarycalcstream_type = 0;
				fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
				fread(&samplesize_, sizeof(samplesize_), 1, fin);
				fclose(fin);
				break;
			}

		}
	}
}